

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode
          (FileGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  FileDescriptor *file;
  cpp *this_00;
  pointer pcVar5;
  uint uVar6;
  size_type sVar7;
  FileOptions_OptimizeMode FVar8;
  pointer puVar9;
  mapped_type *pmVar10;
  FileGenerator *options;
  Options *options_00;
  Descriptor *descriptor;
  int iVar11;
  _Alloc_hider _Var12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int num_deps;
  string local_2e0;
  Options *local_2c0;
  Formatter format;
  string local_280;
  uint local_25c;
  string protodef_name;
  string file_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  ulong local_1f0;
  unsigned_long local_1e8;
  size_type local_1e0;
  char *local_1d8;
  key_type local_1d0;
  CrossFileReferences refs;
  FileDescriptorProto file_proto;
  
  __x = &this->variables_;
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&__x->_M_t);
  puVar9 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != puVar2) {
    file_proto.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)((long)puVar2 - (long)puVar9 >> 3);
    Formatter::operator()
              (&format,"static ::$proto_ns$::Metadata $file_level_metadata$[$1$];\n",
               (unsigned_long *)&file_proto);
  }
  puVar3 = (this->enum_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->enum_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 == puVar4) {
    Formatter::operator()<>
              (&format,
               "static constexpr ::$proto_ns$::EnumDescriptor const** $file_level_enum_descriptors$ = nullptr;\n"
              );
  }
  else {
    file_proto.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)((long)puVar4 - (long)puVar3 >> 3);
    Formatter::operator()
              (&format,
               "static const ::$proto_ns$::EnumDescriptor* $file_level_enum_descriptors$[$1$];\n",
               (unsigned_long *)&file_proto);
  }
  file = this->file_;
  local_2c0 = &this->options_;
  if ((((*(int *)(file + 0x34) < 1) ||
       (FVar8 = GetOptimizeFor(file,local_2c0,(bool *)0x0),
       FVar8 == FileOptions_OptimizeMode_LITE_RUNTIME)) ||
      (*(char *)(*(long *)(file + 0x78) + 0x9b) != '\x01')) || (*(int *)(this->file_ + 0x34) < 1)) {
    Formatter::operator()<>
              (&format,
               "static constexpr ::$proto_ns$::ServiceDescriptor const** $file_level_service_descriptors$ = nullptr;\n"
              );
  }
  else {
    file_proto.super_Message.super_MessageLite._vptr_MessageLite._0_4_ =
         *(int *)(this->file_ + 0x34);
    Formatter::operator()
              (&format,
               "static const ::$proto_ns$::ServiceDescriptor* $file_level_service_descriptors$[$1$];\n"
               ,(int *)&file_proto);
  }
  if ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Formatter::operator()<>
              (&format,
               "const $uint32$ $tablename$::offsets[1] = {};\nstatic constexpr ::$proto_ns$::internal::MigrationSchema* schemas = nullptr;\nstatic constexpr ::$proto_ns$::Message* const* file_default_instances = nullptr;\n\n"
              );
  }
  else {
    Formatter::operator()<>
              (&format,
               "\nconst $uint32$ $tablename$::offsets[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
              );
    io::Printer::Indent(format.printer_);
    protodef_name._M_dataplus._M_p = (pointer)0x0;
    protodef_name._M_string_length = 0;
    protodef_name.field_2._M_allocated_capacity = 0;
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::reserve((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)&protodef_name,
              (long)(this->message_generators_).
                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->message_generators_).
                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    puVar9 = (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->message_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != puVar9) {
      uVar15 = 0;
      do {
        file_proto.super_Message.super_MessageLite =
             (MessageLite)
             MessageGenerator::GenerateOffsets
                       (puVar9[uVar15]._M_t.
                        super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                        .
                        super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>
                        ._M_head_impl,printer);
        if (protodef_name._M_string_length == protodef_name.field_2._M_allocated_capacity) {
          std::
          vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                    ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                      *)&protodef_name,(iterator)protodef_name._M_string_length,
                     (pair<unsigned_long,_unsigned_long> *)&file_proto);
        }
        else {
          *(_func_int ***)protodef_name._M_string_length =
               file_proto.super_Message.super_MessageLite._vptr_MessageLite;
          *(intptr_t *)(protodef_name._M_string_length + 8) =
               file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_;
          protodef_name._M_string_length = protodef_name._M_string_length + 0x10;
        }
        uVar15 = uVar15 + 1;
        puVar9 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar15 < (ulong)((long)(this->message_generators_).
                                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 3
                               ));
    }
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>
              (&format,
               "};\nstatic const ::$proto_ns$::internal::MigrationSchema schemas[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
              );
    io::Printer::Indent(format.printer_);
    puVar9 = (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->message_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != puVar9) {
      lVar13 = 0;
      uVar15 = 0;
      iVar11 = 0;
      do {
        MessageGenerator::GenerateSchema
                  (puVar9[uVar15]._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>
                   ._M_head_impl,printer,iVar11,
                   *(int *)(protodef_name._M_dataplus._M_p + lVar13 + 8));
        iVar11 = iVar11 + *(int *)(protodef_name._M_dataplus._M_p + lVar13);
        uVar15 = uVar15 + 1;
        puVar9 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar13 = lVar13 + 0x10;
      } while (uVar15 < (ulong)((long)(this->message_generators_).
                                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 3
                               ));
    }
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>
              (&format,
               "};\n\nstatic ::$proto_ns$::Message const * const file_default_instances[] = {\n");
    io::Printer::Indent(format.printer_);
    puVar9 = (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->message_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != puVar9) {
      uVar15 = 0;
      options = this;
      do {
        this_00 = (cpp *)(puVar9[uVar15]._M_t.
                          super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                          .
                          super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>
                         ._M_head_impl)->descriptor_;
        Namespace_abi_cxx11_
                  ((string *)&file_proto,this_00,(Descriptor *)local_2c0,(Options *)options);
        ClassName_abi_cxx11_((string *)&refs,this_00,descriptor);
        Formatter::operator()
                  (&format,
                   "reinterpret_cast<const ::$proto_ns$::Message*>(&$1$::_$2$_default_instance_),\n"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_proto
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&refs);
        if ((__node_base *)refs.weak_default_instances._M_h._M_buckets !=
            &refs.weak_default_instances._M_h._M_before_begin) {
          operator_delete(refs.weak_default_instances._M_h._M_buckets);
        }
        if ((HasBits<1UL> *)file_proto.super_Message.super_MessageLite._vptr_MessageLite !=
            &file_proto._has_bits_) {
          operator_delete(file_proto.super_Message.super_MessageLite._vptr_MessageLite);
        }
        uVar15 = uVar15 + 1;
        puVar9 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        options = (FileGenerator *)
                  ((long)(this->message_generators_).
                         super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 3);
      } while (uVar15 < options);
    }
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>(&format,"};\n\n");
    if (protodef_name._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(protodef_name._M_dataplus._M_p);
    }
  }
  file_proto.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)&file_proto._has_bits_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&file_proto,"descriptor_table_protodef","");
  UniqueName(&protodef_name,(string *)&file_proto,*(string **)this->file_,local_2c0);
  if ((HasBits<1UL> *)file_proto.super_Message.super_MessageLite._vptr_MessageLite !=
      &file_proto._has_bits_) {
    operator_delete(file_proto.super_Message.super_MessageLite._vptr_MessageLite);
  }
  Formatter::operator()
            (&format,"const char $1$[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) =\n",&protodef_name
            );
  io::Printer::Indent(format.printer_);
  FileDescriptorProto::FileDescriptorProto(&file_proto,(Arena *)0x0,false);
  FileDescriptor::CopyTo(this->file_,&file_proto);
  file_data._M_dataplus._M_p = (pointer)&file_data.field_2;
  file_data._M_string_length = 0;
  file_data.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)&file_proto,&file_data);
  if (file_data._M_string_length < 0x10000) {
    if (file_data._M_string_length != 0) {
      uVar15 = 0;
      do {
        std::__cxx11::string::substr((ulong)&local_280,(ulong)&file_data);
        CEscape(&local_2e0,&local_280);
        EscapeTrigraphs((string *)&refs,&local_2e0);
        Formatter::operator()
                  (&format,"\"$1$\"\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&refs);
        if ((__node_base *)refs.weak_default_instances._M_h._M_buckets !=
            &refs.weak_default_instances._M_h._M_before_begin) {
          operator_delete(refs.weak_default_instances._M_h._M_buckets);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p);
        }
        uVar15 = uVar15 + 0x28;
      } while (uVar15 < file_data._M_string_length);
    }
  }
  else {
    Formatter::operator()<>(&format,"{ ");
    uVar15 = 0;
    while( true ) {
      uVar14 = (ulong)(int)uVar15;
      if (file_data._M_string_length <= uVar14) break;
      local_25c = (int)uVar15 + 0x19;
      iVar11 = 0;
      local_1f0 = uVar15;
      do {
        if (file_data._M_string_length <= uVar14) {
          uVar6 = (int)local_1f0 - iVar11;
          break;
        }
        std::__cxx11::string::substr((ulong)&local_2e0,(ulong)&file_data);
        CEscape((string *)&refs,&local_2e0);
        Formatter::operator()
                  (&format,"\'$1$\', ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&refs);
        if ((__node_base *)refs.weak_default_instances._M_h._M_buckets !=
            &refs.weak_default_instances._M_h._M_before_begin) {
          operator_delete(refs.weak_default_instances._M_h._M_buckets);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        uVar14 = uVar14 + 1;
        iVar11 = iVar11 + -1;
        uVar6 = local_25c;
      } while (iVar11 != -0x19);
      uVar15 = (ulong)uVar6;
      Formatter::operator()<>(&format,"\n");
    }
    Formatter::operator()<>(&format,"\'\\0\' }");
  }
  Formatter::operator()<>(&format,";\n");
  io::Printer::Outdent(format.printer_);
  refs.weak_default_instances._M_h._M_buckets = &refs.weak_default_instances._M_h._M_single_bucket;
  options_00 = (Options *)0x1;
  refs.weak_default_instances._M_h._M_bucket_count = 1;
  refs.weak_default_instances._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.weak_default_instances._M_h._M_element_count = 0;
  refs.weak_default_instances._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  refs.weak_default_instances._M_h._M_rehash_policy._M_next_resize = 0;
  refs.weak_default_instances._M_h._M_single_bucket = (__node_base_ptr)0x0;
  refs.strong_reflection_files._M_h._M_buckets = &refs.strong_reflection_files._M_h._M_single_bucket
  ;
  refs.strong_reflection_files._M_h._M_bucket_count = 1;
  refs.strong_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.strong_reflection_files._M_h._M_element_count = 0;
  refs.strong_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  refs.strong_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  refs.strong_reflection_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  refs.weak_reflection_files._M_h._M_buckets = &refs.weak_reflection_files._M_h._M_single_bucket;
  refs.weak_reflection_files._M_h._M_bucket_count = 1;
  refs.weak_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.weak_reflection_files._M_h._M_element_count = 0;
  refs.weak_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  refs.weak_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  refs.weak_reflection_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  GetCrossFileReferencesForFile(this,this->file_,&refs);
  num_deps = (int)refs.weak_reflection_files._M_h._M_element_count +
             (int)refs.strong_reflection_files._M_h._M_element_count;
  if (0 < num_deps) {
    Formatter::operator()
              (&format,
               "static const ::$proto_ns$::internal::DescriptorTable*const $desc_table$_deps[$1$] = {\n"
               ,&num_deps);
    anon_unknown_60::Sorted<google::protobuf::FileDescriptor>
              ((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&local_280,
               (unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)refs.strong_reflection_files._M_h._M_before_begin._M_nxt);
    sVar7 = local_280._M_string_length;
    if (local_280._M_dataplus._M_p != (pointer)local_280._M_string_length) {
      _Var12._M_p = local_280._M_dataplus._M_p;
      do {
        DescriptorTableName_abi_cxx11_
                  (&local_2e0,*(cpp **)_Var12._M_p,(FileDescriptor *)local_2c0,options_00);
        Formatter::operator()(&format,"  &::$1$,\n",&local_2e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        _Var12._M_p = _Var12._M_p + 8;
      } while (_Var12._M_p != (pointer)sVar7);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    anon_unknown_60::Sorted<google::protobuf::FileDescriptor>
              ((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&local_280,
               (unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)refs.weak_reflection_files._M_h._M_before_begin._M_nxt);
    if (local_280._M_dataplus._M_p != (pointer)local_280._M_string_length) {
      _Var12._M_p = local_280._M_dataplus._M_p;
      do {
        DescriptorTableName_abi_cxx11_
                  (&local_2e0,*(cpp **)_Var12._M_p,(FileDescriptor *)local_2c0,options_00);
        Formatter::operator()(&format,"  &::$1$,\n",&local_2e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        _Var12._M_p = _Var12._M_p + 8;
      } while (_Var12._M_p != (pointer)local_280._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    Formatter::operator()<>(&format,"};\n");
  }
  iVar11 = num_deps;
  local_1d8 = "false";
  local_1e0 = file_data._M_string_length;
  if (num_deps == 0) {
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"nullptr","");
  }
  else {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"desc_table","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](__x,&local_280);
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    pcVar5 = (pmVar10->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar5,pcVar5 + pmVar10->_M_string_length);
    std::__cxx11::string::append((char *)&local_2e0);
  }
  puVar9 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1e8 = (long)puVar2 - (long)puVar9 >> 3;
  if (puVar2 == puVar9) {
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"nullptr","");
  }
  else {
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"file_level_metadata","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](__x,&local_1d0);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    pcVar5 = (pmVar10->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,pcVar5,pcVar5 + pmVar10->_M_string_length);
  }
  Formatter::operator()
            (&format,
             "static ::$proto_ns$::internal::once_flag $desc_table$_once;\nconst ::$proto_ns$::internal::DescriptorTable $desc_table$ = {\n  false, $1$, $2$, $3$, \"$filename$\", \n  &$desc_table$_once, $4$, $5$, $6$,\n  schemas, file_default_instances, $tablename$::offsets,\n  $7$, $file_level_enum_descriptors$, $file_level_service_descriptors$,\n};\nPROTOBUF_ATTRIBUTE_WEAK const ::$proto_ns$::internal::DescriptorTable* $desc_table$_getter() {\n  return &$desc_table$;\n}\n\n"
             ,&local_1d8,&local_1e0,&protodef_name,&local_2e0,&num_deps,&local_1e8,&local_210);
  paVar1 = &local_210.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar1) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if ((puVar9 != puVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2)) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  if ((iVar11 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2)) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  iVar11 = std::__cxx11::string::compare(*(char **)this->file_);
  if (iVar11 != 0) {
    local_210._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"dynamic_init_dummy","");
    UniqueName(&local_2e0,&local_210,*(string **)this->file_,local_2c0);
    Formatter::operator()
              (&format,
               "// Force running AddDescriptors() at dynamic initialization time.\nPROTOBUF_ATTRIBUTE_INIT_PRIORITY static ::$proto_ns$::internal::AddDescriptorsRunner $1$(&$desc_table$);\n"
               ,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p);
    }
  }
  std::
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&refs.weak_reflection_files._M_h);
  std::
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&refs.strong_reflection_files._M_h);
  std::
  _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&refs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)file_data._M_dataplus._M_p != &file_data.field_2) {
    operator_delete(file_data._M_dataplus._M_p);
  }
  FileDescriptorProto::~FileDescriptorProto(&file_proto);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)protodef_name._M_dataplus._M_p != &protodef_name.field_2) {
    operator_delete(protodef_name._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateReflectionInitializationCode(io::Printer* printer) {
  Formatter format(printer, variables_);

  if (!message_generators_.empty()) {
    format("static ::$proto_ns$::Metadata $file_level_metadata$[$1$];\n",
           message_generators_.size());
  }
  if (!enum_generators_.empty()) {
    format(
        "static "
        "const ::$proto_ns$::EnumDescriptor* "
        "$file_level_enum_descriptors$[$1$];\n",
        enum_generators_.size());
  } else {
    format(
        "static "
        "constexpr ::$proto_ns$::EnumDescriptor const** "
        "$file_level_enum_descriptors$ = nullptr;\n");
  }
  if (HasGenericServices(file_, options_) && file_->service_count() > 0) {
    format(
        "static "
        "const ::$proto_ns$::ServiceDescriptor* "
        "$file_level_service_descriptors$[$1$];\n",
        file_->service_count());
  } else {
    format(
        "static "
        "constexpr ::$proto_ns$::ServiceDescriptor const** "
        "$file_level_service_descriptors$ = nullptr;\n");
  }

  if (!message_generators_.empty()) {
    format(
        "\n"
        "const $uint32$ $tablename$::offsets[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();
    std::vector<std::pair<size_t, size_t> > pairs;
    pairs.reserve(message_generators_.size());
    for (int i = 0; i < message_generators_.size(); i++) {
      pairs.push_back(message_generators_[i]->GenerateOffsets(printer));
    }
    format.Outdent();
    format(
        "};\n"
        "static const ::$proto_ns$::internal::MigrationSchema schemas[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();
    {
      int offset = 0;
      for (int i = 0; i < message_generators_.size(); i++) {
        message_generators_[i]->GenerateSchema(printer, offset,
                                               pairs[i].second);
        offset += pairs[i].first;
      }
    }
    format.Outdent();
    format(
        "};\n"
        "\nstatic "
        "::$proto_ns$::Message const * const file_default_instances[] = {\n");
    format.Indent();
    for (int i = 0; i < message_generators_.size(); i++) {
      const Descriptor* descriptor = message_generators_[i]->descriptor_;
      format(
          "reinterpret_cast<const "
          "::$proto_ns$::Message*>(&$1$::_$2$_default_instance_),\n",
          Namespace(descriptor, options_),  // 1
          ClassName(descriptor));           // 2
    }
    format.Outdent();
    format(
        "};\n"
        "\n");
  } else {
    // we still need these symbols to exist
    format(
        // MSVC doesn't like empty arrays, so we add a dummy.
        "const $uint32$ $tablename$::offsets[1] = {};\n"
        "static constexpr ::$proto_ns$::internal::MigrationSchema* schemas = "
        "nullptr;"
        "\n"
        "static constexpr ::$proto_ns$::Message* const* "
        "file_default_instances = nullptr;\n"
        "\n");
  }

  // ---------------------------------------------------------------

  // Embed the descriptor.  We simply serialize the entire
  // FileDescriptorProto/ and embed it as a string literal, which is parsed and
  // built into real descriptors at initialization time.
  const std::string protodef_name =
      UniqueName("descriptor_table_protodef", file_, options_);
  format("const char $1$[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) =\n",
         protodef_name);
  format.Indent();
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);
  std::string file_data;
  file_proto.SerializeToString(&file_data);

  {
    if (file_data.size() > 65535) {
      // Workaround for MSVC: "Error C1091: compiler limit: string exceeds
      // 65535 bytes in length". Declare a static array of chars rather than
      // use a string literal. Only write 25 bytes per line.
      static const int kBytesPerLine = 25;
      format("{ ");
      for (int i = 0; i < file_data.size();) {
        for (int j = 0; j < kBytesPerLine && i < file_data.size(); ++i, ++j) {
          format("'$1$', ", CEscape(file_data.substr(i, 1)));
        }
        format("\n");
      }
      format("'\\0' }");  // null-terminate
    } else {
      // Only write 40 bytes per line.
      static const int kBytesPerLine = 40;
      for (int i = 0; i < file_data.size(); i += kBytesPerLine) {
        format(
            "\"$1$\"\n",
            EscapeTrigraphs(CEscape(file_data.substr(i, kBytesPerLine))));
      }
    }
    format(";\n");
  }
  format.Outdent();

  CrossFileReferences refs;
  GetCrossFileReferencesForFile(file_, &refs);
  int num_deps =
      refs.strong_reflection_files.size() + refs.weak_reflection_files.size();

  // Build array of DescriptorTable deps.
  if (num_deps > 0) {
    format(
        "static const ::$proto_ns$::internal::DescriptorTable*const "
        "$desc_table$_deps[$1$] = {\n",
        num_deps);

    for (auto dep : Sorted(refs.strong_reflection_files)) {
      format("  &::$1$,\n", DescriptorTableName(dep, options_));
    }
    for (auto dep : Sorted(refs.weak_reflection_files)) {
      format("  &::$1$,\n", DescriptorTableName(dep, options_));
    }

    format("};\n");
  }

  // The DescriptorTable itself.
  // Should be "bool eager = NeedsEagerDescriptorAssignment(file_, options_);"
  // however this might cause a tsan failure in superroot b/148382879,
  // so disable for now.
  bool eager = false;
  format(
      "static ::$proto_ns$::internal::once_flag $desc_table$_once;\n"
      "const ::$proto_ns$::internal::DescriptorTable $desc_table$ = {\n"
      "  false, $1$, $2$, $3$, \"$filename$\", \n"
      "  &$desc_table$_once, $4$, $5$, $6$,\n"
      "  schemas, file_default_instances, $tablename$::offsets,\n"
      "  $7$, $file_level_enum_descriptors$, "
      "$file_level_service_descriptors$,\n"
      "};\n"
      // This function exists to be marked as weak.
      // It can significantly speed up compilation by breaking up LLVM's SCC in
      // the .pb.cc translation units. Large translation units see a reduction
      // of more than 35% of walltime for optimized builds.
      // Without the weak attribute all the messages in the file, including all
      // the vtables and everything they use become part of the same SCC through
      // a cycle like:
      // GetMetadata -> descriptor table -> default instances ->
      //   vtables -> GetMetadata
      // By adding a weak function here we break the connection from the
      // individual vtables back into the descriptor table.
      "PROTOBUF_ATTRIBUTE_WEAK const ::$proto_ns$::internal::DescriptorTable* "
      "$desc_table$_getter() {\n"
      "  return &$desc_table$;\n"
      "}\n"
      "\n",
      eager ? "true" : "false", file_data.size(), protodef_name,
      num_deps == 0 ? "nullptr" : variables_["desc_table"] + "_deps", num_deps,
      message_generators_.size(),
      message_generators_.empty() ? "nullptr"
                                  : variables_["file_level_metadata"]);

  // For descriptor.proto we want to avoid doing any dynamic initialization,
  // because in some situations that would otherwise pull in a lot of
  // unnecessary code that can't be stripped by --gc-sections. Descriptor
  // initialization will still be performed lazily when it's needed.
  if (file_->name() != "net/proto2/proto/descriptor.proto") {
    format(
        "// Force running AddDescriptors() at dynamic initialization time.\n"
        "PROTOBUF_ATTRIBUTE_INIT_PRIORITY "
        "static ::$proto_ns$::internal::AddDescriptorsRunner "
        "$1$(&$desc_table$);\n",
        UniqueName("dynamic_init_dummy", file_, options_));
  }
}